

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive_impl.cpp
# Opt level: O3

void __thiscall boost::archive::json_iarchive_impl::load_data(json_iarchive_impl *this)

{
  json_archive *this_00;
  bool bVar1;
  Json *pJVar2;
  reference this_01;
  key_type *pkVar3;
  int *piVar4;
  long lVar5;
  mapped_type *this_02;
  reference pvVar6;
  undefined8 uVar7;
  undefined1 local_90 [8];
  iterator itr;
  undefined1 local_60 [8];
  int ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  json_iarchive_impl *local_40;
  int local_34;
  
  this_00 = &(this->super_json_archive_interface).archive_;
  local_40 = this;
  json_archive::push_class_repository(this_00);
  pJVar2 = json_archive::get_data_abi_cxx11_(this_00);
  itr.m_object = (pointer)0x0;
  itr.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  itr.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x8000000000000000;
  local_90 = (undefined1  [8])pJVar2;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_90);
  _ret = (_Base_ptr)0x0;
  aStack_50._M_allocated_capacity = 0;
  aStack_50._8_8_ = -0x8000000000000000;
  itr.m_it.primitive_iterator.m_it = (difference_type)pJVar2;
  local_60 = (undefined1  [8])pJVar2;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)local_60);
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_90,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_60);
  if (!bVar1) {
    local_40 = (json_iarchive_impl *)&(local_40->super_json_archive_interface).class_map_;
    do {
      this_01 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)local_90);
      pkVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)local_90);
      pJVar2 = (Json *)(pkVar3->_M_dataplus)._M_p;
      piVar4 = __errno_location();
      local_34 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol((char *)pJVar2,(char **)local_60,10);
      if (local_60 == (undefined1  [8])pJVar2) {
        std::__throw_invalid_argument("stoi");
LAB_0013f3f7:
        uVar7 = std::__throw_out_of_range("stoi");
        if (*piVar4 == 0) {
          *piVar4 = local_34;
        }
        _Unwind_Resume(uVar7);
      }
      if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_0013f3f7;
      if (*piVar4 == 0) {
        *piVar4 = local_34;
      }
      local_60._0_4_ = (int)lVar5;
      this_02 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_boost::archive::ClassInfo>,_std::allocator<std::pair<const_unsigned_int,_boost::archive::ClassInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_boost::archive::ClassInfo>,_std::allocator<std::pair<const_unsigned_int,_boost::archive::ClassInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_40,(key_type *)local_60);
      pvVar6 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this_01,(key_type *)param::ClassNameType_abi_cxx11_);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 pvVar6);
      std::__cxx11::string::operator=((string *)this_02,(string *)local_60);
      if (local_60 != (undefined1  [8])&aStack_50) {
        operator_delete((void *)local_60);
      }
      pvVar6 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this_01,(key_type *)param::TrackingType_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar6,(int *)local_60);
      this_02->track_ = local_60._0_4_;
      pvVar6 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this_01,(key_type *)param::VersionType_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar6,(int *)local_60);
      this_02->version_ = local_60._0_4_;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)local_90);
      local_60 = (undefined1  [8])itr.m_it.primitive_iterator.m_it;
      _ret = (_Base_ptr)0x0;
      aStack_50._M_allocated_capacity = 0;
      aStack_50._8_8_ = -0x8000000000000000;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)local_60);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_90,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_60);
    } while (!bVar1);
  }
  json_archive::pop_data(this_00);
  return;
}

Assistant:

void json_iarchive_impl::load_data()
{
    archive_.push_class_repository();
    Json& data = archive_.get_data();
    for(auto itr = data.begin(); itr != data.end(); itr++)
    {
        auto& value = *itr;
        ClassInfo& dst = class_map_[std::stoi(itr.key())];
        dst.name_ = value[param::ClassNameType];
        dst.track_ = value[param::TrackingType];
        dst.version_ = value[param::VersionType];
    }
    archive_.pop_data();
}